

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPLayer.cpp
# Opt level: O2

void __thiscall TCPLayer::notifyWrite(TCPLayer *this)

{
  Buffer *this_00;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ssize_t sVar4;
  unsigned_long uVar5;
  size_t in_RCX;
  int in_R8D;
  Buffer packet;
  _Vector_base<char,_std::allocator<char>_> _Stack_38;
  
  this_00 = &this->outgoingPacket;
  iVar1 = Buffer::getSize(this_00);
  if (0 < iVar1) {
    pcVar3 = Buffer::getData(this_00);
    uVar2 = Buffer::getSize(this_00);
    sVar4 = TCPSocket::send(&this->socket,(int)pcVar3,(void *)(ulong)uVar2,in_RCX,in_R8D);
    Buffer::consume(this_00,(long)(int)sVar4);
    return;
  }
  uVar5 = SynchronizedQueue<Buffer>::getSize(&this->packetsToSend);
  if (uVar5 != 0) {
    SynchronizedQueue<Buffer>::get((Buffer *)&_Stack_38,&this->packetsToSend);
    uVar2 = Buffer::getSize((Buffer *)&_Stack_38);
    Buffer::append(this_00,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                           uVar2 << 0x18);
    pcVar3 = Buffer::getData((Buffer *)&_Stack_38);
    iVar1 = Buffer::getSize((Buffer *)&_Stack_38);
    Buffer::append(this_00,pcVar3,(long)iVar1);
    pcVar3 = Buffer::getData(this_00);
    uVar2 = Buffer::getSize(this_00);
    sVar4 = TCPSocket::send(&this->socket,(int)pcVar3,(void *)(ulong)uVar2,in_RCX,in_R8D);
    Buffer::consume(this_00,(long)(int)sVar4);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&_Stack_38);
  }
  return;
}

Assistant:

void TCPLayer::notifyWrite() {
    if(outgoingPacket.getSize() > 0){
        int sentBytes = socket.send(outgoingPacket.getData(), outgoingPacket.getSize());
        outgoingPacket.consume(sentBytes);
    }
    else{
        if(packetsToSend.getSize() > 0){
            auto packet = packetsToSend.get();
            outgoingPacket.append(::htonl(packet.getSize()));
            outgoingPacket.append(packet.getData(), packet.getSize());

            int sentBytes = socket.send(outgoingPacket.getData(), outgoingPacket.getSize());
            outgoingPacket.consume(sentBytes);
        }
    }
}